

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::hint(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if either target or mode is not an accepted value.",
             &local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glHint(&ctx->super_CallLogWrapper,0x8192,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glHint(&ctx->super_CallLogWrapper,0xffffffff,0x1101);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glHint(&ctx->super_CallLogWrapper,0xffffffff,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void hint (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if either target or mode is not an accepted value.");
	ctx.glHint(GL_GENERATE_MIPMAP_HINT, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glHint(-1, GL_FASTEST);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glHint(-1, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}